

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O3

pair<QArrayData_*,_void_*>
QArrayData::reallocateUnaligned
          (QArrayData *data,void *dataPointer,qsizetype objectSize,qsizetype capacity,
          AllocationOption option)

{
  ulong headerSize;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  QArrayData *pQVar5;
  size_t __size;
  long lVar6;
  void *pvVar7;
  pair<QArrayData_*,_void_*> pVar8;
  CalculateGrowingBlockSizeResult CVar9;
  
  headerSize = (ulong)(objectSize < 3) * 2 + 0x10;
  if (option == Grow) {
    CVar9 = qCalculateGrowingBlockSize(capacity,objectSize,headerSize);
    capacity = CVar9.elementCount;
    __size = CVar9.size;
LAB_001060ba:
    if (-1 < (long)__size) {
      pQVar5 = (QArrayData *)realloc(data,__size);
      if (pQVar5 != (QArrayData *)0x0) {
        lVar6 = 0x10;
        if (dataPointer != (void *)0x0) {
          lVar6 = (long)dataPointer - (long)data;
        }
        pQVar5->alloc = capacity;
        pvVar7 = (void *)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + lVar6);
        goto LAB_001060e9;
      }
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = objectSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = capacity;
    uVar3 = SUB168(auVar1 * auVar2,0);
    if (SUB168(auVar1 * auVar2,8) == 0) {
      sVar4 = uVar3 + headerSize;
      if (!CARRY8(uVar3,headerSize)) {
        __size = 0xffffffffffffffff;
        if (-1 < (long)sVar4) {
          __size = sVar4;
        }
        goto LAB_001060ba;
      }
    }
  }
  pvVar7 = (void *)0x0;
  pQVar5 = (QArrayData *)0x0;
LAB_001060e9:
  pVar8.second = pvVar7;
  pVar8.first = pQVar5;
  return pVar8;
}

Assistant:

std::pair<QArrayData *, void *>
QArrayData::reallocateUnaligned(QArrayData *data, void *dataPointer,
                                qsizetype objectSize, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(!data || !data->isShared());

    const qsizetype headerSize = sizeof(AlignedQArrayData);
    auto r = calculateBlockSize(capacity, objectSize, headerSize, option);
    qsizetype allocSize = r.size;
    capacity = r.elementCount;
    if (Q_UNLIKELY(allocSize < 0))
        return {};

    const qptrdiff offset = dataPointer
            ? reinterpret_cast<char *>(dataPointer) - reinterpret_cast<char *>(data)
            : headerSize;
    Q_ASSERT(offset > 0);
    Q_ASSERT(offset <= allocSize); // equals when all free space is at the beginning

    QArrayData *header = static_cast<QArrayData *>(::realloc(data, size_t(allocSize)));
    if (header) {
        header->alloc = capacity;
        dataPointer = reinterpret_cast<char *>(header) + offset;
    } else {
        dataPointer = nullptr;
    }
    return {header, dataPointer};
}